

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump.cc
# Opt level: O3

ostream * pstack::operator<<(ostream *os,JSON<pstack::ProgramHeaderName,_char> *ph)

{
  int iVar1;
  _Base_ptr p_Var2;
  ostream *poVar3;
  _Base_ptr p_Var4;
  initializer_list<std::pair<const_int,_const_char_*>_> __l;
  _Base_ptr *local_e0;
  less<int> *local_d8;
  allocator_type local_2a;
  less<int> local_29;
  
  if ((operator<<(std::ostream&,pstack::JSON<pstack::ProgramHeaderName,char>const&)::names == '\0')
     && (iVar1 = __cxa_guard_acquire(&operator<<(std::ostream&,pstack::JSON<pstack::ProgramHeaderName,char>const&)
                                      ::names), iVar1 != 0)) {
    memcpy((iterator)&local_e0,&DAT_0017b230,0xb0);
    __l._M_len = 0xb;
    __l._M_array = (iterator)&local_e0;
    std::
    map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>::
    map(&operator<<::names,__l,&local_29,&local_2a);
    __cxa_atexit(std::
                 map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
                 ::~map,&operator<<::names,&__dso_handle);
    __cxa_guard_release(&operator<<(std::ostream&,pstack::JSON<pstack::ProgramHeaderName,char>const&)
                         ::names);
  }
  if (operator<<::names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    iVar1 = ph->object->type;
    p_Var2 = &operator<<::names._M_t._M_impl.super__Rb_tree_header._M_header;
    p_Var4 = operator<<::names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    do {
      if (iVar1 <= (int)p_Var4[1]._M_color) {
        p_Var2 = p_Var4;
      }
      p_Var4 = (&p_Var4->_M_left)[(int)p_Var4[1]._M_color < iVar1];
    } while (p_Var4 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var2 != &operator<<::names._M_t._M_impl.super__Rb_tree_header) &&
       ((int)p_Var2[1]._M_color <= iVar1)) {
      local_e0 = &p_Var2[1]._M_parent;
      local_d8 = &local_29;
      local_29 = (less<int>)0x0;
      poVar3 = operator<<(os,(JSON<const_char_*,_char> *)&local_e0);
      return poVar3;
    }
  }
  local_e0._0_1_ = 0x22;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_e0,1);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,ph->object->type);
  local_e0 = (_Base_ptr *)CONCAT71(local_e0._1_7_,0x22);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_e0,1);
  return poVar3;
}

Assistant:

std::ostream &operator << (std::ostream &os, const JSON<ProgramHeaderName> &ph)
{
    static const std::map<int, const char *> names = {
#define strpair(x) { x, #x }
        strpair(PT_NULL),
        strpair(PT_LOAD),
        strpair(PT_DYNAMIC),
        strpair(PT_INTERP),
        strpair(PT_NOTE),
        strpair(PT_SHLIB),
        strpair(PT_PHDR),
        strpair(PT_TLS),
        strpair(PT_GNU_EH_FRAME),
        strpair(PT_GNU_STACK),
        strpair(PT_GNU_RELRO)
#undef strpair
    };
    auto namei = names.find(ph.object.type);
    if (namei != names.end())
        return os << json(namei->second);
    return os << '"' << ph.object.type << '"';
}